

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandPrintSymms(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint fVerbose;
  char *pcVar4;
  uint fUseBdds;
  uint local_40;
  uint local_3c;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fUseBdds = 0;
  Extra_UtilGetoptReset();
  local_3c = 1;
  local_40 = 0;
  fVerbose = 0;
  while (iVar1 = Extra_UtilGetopt(argc,argv,"bnrvh"), iVar1 != -1) {
    switch((iVar1 - 0x62U) * 0x40000000 | iVar1 - 0x62U >> 2) {
    case 0:
      fUseBdds = fUseBdds ^ 1;
      break;
    default:
      iVar1 = -2;
      Abc_Print(-2,"usage: print_symm [-bnrvh]\n");
      Abc_Print(-2,"\t         computes symmetries of the PO functions\n");
      pcVar3 = "BDD";
      if (fUseBdds == 0) {
        pcVar3 = "SAT";
      }
      Abc_Print(-2,"\t-b     : toggle BDD-based or SAT-based computations [default = %s].\n",pcVar3)
      ;
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (local_40 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-n     : enable naive BDD-based computation [default = %s].\n",pcVar3);
      pcVar3 = "yes";
      if (local_3c == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-r     : enable dynamic BDD variable reordering [default = %s].\n",pcVar3);
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : enable verbose output [default = %s].\n",pcVar4);
      pcVar3 = "\t-h     : print the command usage\n";
      goto LAB_0021dc33;
    case 3:
      local_40 = local_40 ^ 1;
      break;
    case 4:
      local_3c = local_3c ^ 1;
      break;
    case 5:
      fVerbose = fVerbose ^ 1;
    }
  }
  if (pAVar2 == (Abc_Ntk_t *)0x0) {
    pcVar3 = "Empty network.\n";
  }
  else {
    if (pAVar2->nObjCounts[8] == 0) {
      if (pAVar2->ntkType == ABC_NTK_STRASH) {
        Abc_NtkSymmetries(pAVar2,fUseBdds,local_40,local_3c,fVerbose);
        return 0;
      }
      pAVar2 = Abc_NtkStrash(pAVar2,0,0,0);
      Abc_NtkSymmetries(pAVar2,fUseBdds,local_40,local_3c,fVerbose);
      Abc_NtkDelete(pAVar2);
      return 0;
    }
    pcVar3 = "This command works only for combinational networks (run \"comb\").\n";
  }
  iVar1 = -1;
LAB_0021dc33:
  Abc_Print(iVar1,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandPrintSymms( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fUseBdds;
    int fNaive;
    int fReorder;
    int fVerbose;
    extern void Abc_NtkSymmetries( Abc_Ntk_t * pNtk, int fUseBdds, int fNaive, int fReorder, int fVerbose );

    // set defaults
    fUseBdds = 0;
    fNaive   = 0;
    fReorder = 1;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "bnrvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'b':
            fUseBdds ^= 1;
            break;
        case 'n':
            fNaive ^= 1;
            break;
        case 'r':
            fReorder ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "This command works only for combinational networks (run \"comb\").\n" );
        return 1;
    }
    if ( Abc_NtkIsStrash(pNtk) )
        Abc_NtkSymmetries( pNtk, fUseBdds, fNaive, fReorder, fVerbose );
    else
    {
        pNtk = Abc_NtkStrash( pNtk, 0, 0, 0 );
        Abc_NtkSymmetries( pNtk, fUseBdds, fNaive, fReorder, fVerbose );
        Abc_NtkDelete( pNtk );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: print_symm [-bnrvh]\n" );
    Abc_Print( -2, "\t         computes symmetries of the PO functions\n" );
    Abc_Print( -2, "\t-b     : toggle BDD-based or SAT-based computations [default = %s].\n", fUseBdds? "BDD": "SAT" );
    Abc_Print( -2, "\t-n     : enable naive BDD-based computation [default = %s].\n", fNaive? "yes": "no" );
    Abc_Print( -2, "\t-r     : enable dynamic BDD variable reordering [default = %s].\n", fReorder? "yes": "no" );
    Abc_Print( -2, "\t-v     : enable verbose output [default = %s].\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}